

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O3

bool __thiscall KeyValueFile::loadFromString(KeyValueFile *this,char *data,char *debug_file_name)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  PrintErrorFunc p_Var9;
  long *plVar10;
  undefined8 *puVar11;
  undefined7 uVar13;
  PrintErrorFunc p_Var12;
  int iVar14;
  long *plVar15;
  ulong *puVar16;
  ulong uVar17;
  size_type *psVar18;
  PrintErrorFunc p_Var19;
  int iVar20;
  uint uVar21;
  byte bVar22;
  int iVar23;
  string __str;
  StringKeyValue x;
  uint local_1cc;
  long *local_1c8;
  undefined8 local_1c0;
  long local_1b8;
  undefined8 uStack_1b0;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  ulong *local_188;
  long local_180;
  ulong local_178 [2];
  string local_168;
  KeyValueFile *local_148;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  long *local_120 [2];
  long local_110 [2];
  ulong local_100;
  PrintErrorFunc local_f8;
  undefined8 local_f0;
  ulong local_e8;
  int local_dc;
  long local_d8;
  PrintErrorFunc local_d0;
  size_t local_c8;
  undefined1 local_c0 [32];
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  string local_80;
  string local_60;
  vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_> *local_40;
  char *local_38;
  
  pcVar2 = (char *)(this->fileName)._M_string_length;
  local_148 = this;
  strlen(debug_file_name);
  bVar22 = 0;
  std::__cxx11::string::_M_replace((ulong)&this->fileName,0,pcVar2,(ulong)debug_file_name);
  if (data == (char *)0x0) goto LAB_00127cdb;
  if ((*data == -0x11) && (data[1] == -0x45)) {
    data = data + (ulong)(data[2] == -0x41) * 3;
  }
  sVar8 = strlen(data);
  local_c0._0_8_ = local_c0 + 0x10;
  iVar14 = 0;
  local_c0._8_8_ = 0;
  local_c0[0x10] = '\0';
  local_a0._M_p = (pointer)&local_90;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  if (-1 < (int)sVar8) {
    local_dc = (int)sVar8 + -1;
    local_40 = &local_148->kv;
    bVar5 = true;
    local_1cc = 1;
    local_e8 = 0;
    local_f0 = 0;
    local_100 = 0;
    p_Var19 = (PrintErrorFunc)0x0;
    local_f8 = (PrintErrorFunc)data;
    local_c8 = sVar8;
    local_38 = debug_file_name;
LAB_0012678d:
    p_Var9 = (PrintErrorFunc)(long)iVar14;
    bVar22 = (byte)local_f8[(long)p_Var9];
    iVar23 = iVar14;
    if (bVar22 != 0x5c) goto LAB_00126fa4;
    bVar22 = 0x5c;
    iVar23 = (int)local_c8;
    if (iVar14 != local_dc) {
      uVar6 = iVar14 + 1;
      p_Var9 = (PrintErrorFunc)(ulong)uVar6;
      iVar23 = iVar14;
      if ((int)uVar6 < (int)local_c8) {
        p_Var9 = local_f8 + (int)uVar6;
        bVar3 = false;
        iVar20 = iVar14;
        do {
          cVar1 = (char)*p_Var9;
          if (cVar1 == ';') {
            if (local_f8[iVar20] == (_func_void_char_ptr)0x9) {
              bVar3 = true;
            }
            if (local_f8[iVar20] == (_func_void_char_ptr)0x20) {
              bVar3 = true;
            }
            if (!bVar3) break;
          }
          else {
            if ((' ' < cVar1) && (!bVar3)) break;
            if (cVar1 == '\r') {
              if (local_f8[iVar20 + 2] == (_func_void_char_ptr)0xa) {
                iVar23 = 3;
                goto LAB_00126862;
              }
            }
            else if (cVar1 == '\n') {
              iVar23 = 2;
LAB_00126862:
              if ((((ulong)p_Var19 & 1) == 0) || (local_148->printErrorFunc == (PrintErrorFunc)0x0))
              goto LAB_00126be9;
              local_120[0] = local_110;
              local_d0 = local_148->printErrorFunc;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_120,"ERROR: Line concatenation inside comment. At file \'",
                         "");
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)local_120,
                                           (ulong)(local_148->fileName)._M_dataplus._M_p);
              local_140 = &local_130;
              plVar15 = plVar10 + 2;
              if ((long *)*plVar10 == plVar15) {
                local_130 = *plVar15;
                lStack_128 = plVar10[3];
              }
              else {
                local_130 = *plVar15;
                local_140 = (long *)*plVar10;
              }
              local_138 = plVar10[1];
              *plVar10 = (long)plVar15;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
              local_1a8 = &local_198;
              puVar16 = (ulong *)(plVar10 + 2);
              if ((ulong *)*plVar10 == puVar16) {
                local_198 = *puVar16;
                lStack_190 = plVar10[3];
              }
              else {
                local_198 = *puVar16;
                local_1a8 = (ulong *)*plVar10;
              }
              local_1a0 = plVar10[1];
              *plVar10 = (long)puVar16;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              uVar6 = -local_1cc;
              if (0 < (int)local_1cc) {
                uVar6 = local_1cc;
              }
              uVar21 = 1;
              if (uVar6 < 10) goto LAB_001269d1;
              uVar17 = (ulong)uVar6;
              uVar4 = 4;
              goto LAB_00126998;
            }
          }
          iVar20 = iVar20 + 1;
          p_Var9 = p_Var9 + 1;
        } while (local_dc != iVar20);
      }
    }
    goto LAB_00127b6f;
  }
  bVar22 = 1;
  goto LAB_00127cbe;
  while( true ) {
    if (uVar7 < 10000) goto LAB_001269d1;
    uVar17 = uVar17 / 10000;
    uVar4 = uVar21 + 4;
    if (uVar7 < 100000) break;
LAB_00126998:
    uVar21 = uVar4;
    uVar7 = (uint)uVar17;
    if (uVar7 < 100) {
      uVar21 = uVar21 - 2;
      goto LAB_001269d1;
    }
    if (uVar7 < 1000) {
      uVar21 = uVar21 - 1;
      goto LAB_001269d1;
    }
  }
  uVar21 = uVar21 + 1;
LAB_001269d1:
  local_d8 = CONCAT44(local_d8._4_4_,uVar6);
  local_188 = local_178;
  std::__cxx11::string::_M_construct
            ((ulong)&local_188,(char)uVar21 - (char)((int)local_1cc >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(local_1cc >> 0x1f) + (long)local_188),uVar21,(uint)local_d8);
  uVar17 = 0xf;
  if (local_1a8 != &local_198) {
    uVar17 = local_198;
  }
  if (uVar17 < (ulong)(local_180 + local_1a0)) {
    uVar17 = 0xf;
    if (local_188 != local_178) {
      uVar17 = local_178[0];
    }
    if (uVar17 < (ulong)(local_180 + local_1a0)) goto LAB_00126a66;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,(ulong)local_1a8);
  }
  else {
LAB_00126a66:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_188);
  }
  local_1c8 = &local_1b8;
  plVar10 = puVar11 + 2;
  if ((long *)*puVar11 == plVar10) {
    local_1b8 = *plVar10;
    uStack_1b0 = puVar11[3];
  }
  else {
    local_1b8 = *plVar10;
    local_1c8 = (long *)*puVar11;
  }
  local_1c0 = puVar11[1];
  *puVar11 = plVar10;
  puVar11[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  psVar18 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_168.field_2._M_allocated_capacity = *psVar18;
    local_168.field_2._8_4_ = (undefined4)plVar10[3];
    local_168.field_2._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar18;
    local_168._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_168._M_string_length = plVar10[1];
  *plVar10 = (long)psVar18;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  (*local_d0)(local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_188 != local_178) {
    operator_delete(local_188,local_178[0] + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
LAB_00126be9:
  iVar23 = iVar23 + iVar20;
  local_1cc = local_1cc + 1;
  bVar22 = (byte)local_f8[iVar23];
  p_Var9 = (PrintErrorFunc)CONCAT71((int7)((ulong)local_f8 >> 8),(char)bVar22 < '!');
  if (bVar22 != 0x3b && (char)bVar22 >= '!') {
    p_Var9 = local_148->printErrorFunc;
    if (p_Var9 != (PrintErrorFunc)0x0) {
      local_120[0] = local_110;
      local_d8 = (long)iVar23;
      local_d0 = p_Var9;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_120,
                 "ERROR: The next line after the line concatenation symbol \'\\\' must be started with space. At file \'"
                 ,"");
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)local_120,(ulong)(local_148->fileName)._M_dataplus._M_p);
      local_140 = &local_130;
      plVar15 = plVar10 + 2;
      if ((long *)*plVar10 == plVar15) {
        local_130 = *plVar15;
        lStack_128 = plVar10[3];
      }
      else {
        local_130 = *plVar15;
        local_140 = (long *)*plVar10;
      }
      local_138 = plVar10[1];
      *plVar10 = (long)plVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
      puVar16 = (ulong *)(plVar10 + 2);
      if ((ulong *)*plVar10 == puVar16) {
        local_198 = *puVar16;
        lStack_190 = plVar10[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *puVar16;
        local_1a8 = (ulong *)*plVar10;
      }
      local_1a0 = plVar10[1];
      *plVar10 = (long)puVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      uVar6 = -local_1cc;
      if (0 < (int)local_1cc) {
        uVar6 = local_1cc;
      }
      uVar21 = 1;
      if (9 < uVar6) {
        uVar17 = (ulong)uVar6;
        uVar4 = 4;
        do {
          uVar21 = uVar4;
          uVar7 = (uint)uVar17;
          if (uVar7 < 100) {
            uVar21 = uVar21 - 2;
            goto LAB_00126d87;
          }
          if (uVar7 < 1000) {
            uVar21 = uVar21 - 1;
            goto LAB_00126d87;
          }
          if (uVar7 < 10000) goto LAB_00126d87;
          uVar17 = uVar17 / 10000;
          uVar4 = uVar21 + 4;
        } while (99999 < uVar7);
        uVar21 = uVar21 + 1;
      }
LAB_00126d87:
      local_188 = local_178;
      std::__cxx11::string::_M_construct
                ((ulong)&local_188,(char)uVar21 - (char)((int)local_1cc >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(local_1cc >> 0x1f) + (long)local_188),uVar21,uVar6);
      uVar17 = 0xf;
      if (local_1a8 != &local_198) {
        uVar17 = local_198;
      }
      if (uVar17 < (ulong)(local_180 + local_1a0)) {
        uVar17 = 0xf;
        if (local_188 != local_178) {
          uVar17 = local_178[0];
        }
        if (uVar17 < (ulong)(local_180 + local_1a0)) goto LAB_00126e13;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,(ulong)local_1a8);
      }
      else {
LAB_00126e13:
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_188)
        ;
      }
      local_1c8 = &local_1b8;
      plVar10 = puVar11 + 2;
      if ((long *)*puVar11 == plVar10) {
        local_1b8 = *plVar10;
        uStack_1b0 = puVar11[3];
      }
      else {
        local_1b8 = *plVar10;
        local_1c8 = (long *)*puVar11;
      }
      local_1c0 = puVar11[1];
      *puVar11 = plVar10;
      puVar11[1] = 0;
      *(undefined1 *)plVar10 = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      psVar18 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_168.field_2._M_allocated_capacity = *psVar18;
        local_168.field_2._8_4_ = (undefined4)plVar10[3];
        local_168.field_2._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar18;
        local_168._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_168._M_string_length = plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      (*local_d0)(local_168._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      if (local_188 != local_178) {
        operator_delete(local_188,local_178[0] + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120[0] != local_110) {
        operator_delete(local_120[0],local_110[0] + 1);
      }
      bVar22 = (byte)local_f8[local_d8];
      p_Var9 = local_f8;
    }
  }
LAB_00126fa4:
  if ((bVar22 < 0xe) && (p_Var9 = (PrintErrorFunc)0x0, (0x2401U >> (bVar22 & 0x1f) & 1) != 0)) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_c0._0_8_,(pointer)(local_c0._0_8_ + local_c0._8_8_));
    trimStr(&local_168,local_148,&local_60);
    std::__cxx11::string::operator=((string *)local_c0,(string *)&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_a0._M_p,local_a0._M_p + local_98);
    trimStr(&local_168,local_148,&local_80);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_c0._8_8_ != 0) {
      if (((local_98 == 0) || ((local_100 & 1) == 0)) || ((local_e8 & 1) != 0)) {
        uVar13 = (undefined7)((ulong)local_148 >> 8);
        cVar1 = (char)((int)local_1cc >> 0x1f);
        if ((local_e8 & 1) == 0) {
          if ((local_100 & 1) != 0) {
            if (local_98 == 0) {
              p_Var19 = local_148->printErrorFunc;
              local_f0 = CONCAT71(uVar13,1);
              if (p_Var19 != (PrintErrorFunc)0x0) {
                local_120[0] = local_110;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_120,"ERROR: Expected value after \'=\' at file \'","");
                plVar10 = (long *)std::__cxx11::string::_M_append
                                            ((char *)local_120,
                                             (ulong)(local_148->fileName)._M_dataplus._M_p);
                local_140 = &local_130;
                plVar15 = plVar10 + 2;
                if ((long *)*plVar10 == plVar15) {
                  local_130 = *plVar15;
                  lStack_128 = plVar10[3];
                }
                else {
                  local_130 = *plVar15;
                  local_140 = (long *)*plVar10;
                }
                local_138 = plVar10[1];
                *plVar10 = (long)plVar15;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
                puVar16 = puVar11 + 2;
                if ((ulong *)*puVar11 == puVar16) {
                  local_198 = *puVar16;
                  lStack_190 = puVar11[3];
                  local_1a8 = &local_198;
                }
                else {
                  local_198 = *puVar16;
                  local_1a8 = (ulong *)*puVar11;
                }
                local_1a0 = puVar11[1];
                *puVar11 = puVar16;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                uVar6 = -local_1cc;
                if (0 < (int)local_1cc) {
                  uVar6 = local_1cc;
                }
                uVar21 = 1;
                if (9 < uVar6) {
                  uVar17 = (ulong)uVar6;
                  uVar4 = 4;
                  do {
                    uVar21 = uVar4;
                    uVar7 = (uint)uVar17;
                    if (uVar7 < 100) {
                      uVar21 = uVar21 - 2;
                      goto LAB_001278de;
                    }
                    if (uVar7 < 1000) {
                      uVar21 = uVar21 - 1;
                      goto LAB_001278de;
                    }
                    if (uVar7 < 10000) goto LAB_001278de;
                    uVar17 = uVar17 / 10000;
                    uVar4 = uVar21 + 4;
                  } while (99999 < uVar7);
                  uVar21 = uVar21 + 1;
                }
LAB_001278de:
                local_188 = local_178;
                std::__cxx11::string::_M_construct((ulong)&local_188,(char)uVar21 - cVar1);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          ((char *)((ulong)(local_1cc >> 0x1f) + (long)local_188),uVar21,uVar6);
                uVar17 = 0xf;
                if (local_1a8 != &local_198) {
                  uVar17 = local_198;
                }
                if (uVar17 < (ulong)(local_180 + local_1a0)) {
                  uVar17 = 0xf;
                  if (local_188 != local_178) {
                    uVar17 = local_178[0];
                  }
                  if (uVar17 < (ulong)(local_180 + local_1a0)) goto LAB_0012796a;
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_188,0,(char *)0x0,(ulong)local_1a8);
                }
                else {
LAB_0012796a:
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_188);
                }
                local_1c8 = &local_1b8;
                plVar10 = puVar11 + 2;
                if ((long *)*puVar11 == plVar10) {
                  local_1b8 = *plVar10;
                  uStack_1b0 = puVar11[3];
                }
                else {
                  local_1b8 = *plVar10;
                  local_1c8 = (long *)*puVar11;
                }
                local_1c0 = puVar11[1];
                *puVar11 = plVar10;
                puVar11[1] = 0;
                *(undefined1 *)plVar10 = 0;
                plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c8);
                local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                psVar18 = (size_type *)(plVar10 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_168.field_2._M_allocated_capacity = *psVar18;
                  local_168.field_2._8_4_ = (undefined4)plVar10[3];
                  local_168.field_2._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
                }
                else {
                  local_168.field_2._M_allocated_capacity = *psVar18;
                  local_168._M_dataplus._M_p = (pointer)*plVar10;
                }
                local_168._M_string_length = plVar10[1];
                *plVar10 = (long)psVar18;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                (*p_Var19)(local_168._M_dataplus._M_p);
                goto LAB_00127a31;
              }
            }
            goto LAB_00127ae4;
          }
          p_Var19 = local_148->printErrorFunc;
          local_f0 = CONCAT71(uVar13,1);
          if (p_Var19 == (PrintErrorFunc)0x0) goto LAB_00127ae4;
          local_120[0] = local_110;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_120,"ERROR: Expected \'=\' at file \'","");
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)local_120,(ulong)(local_148->fileName)._M_dataplus._M_p);
          local_140 = &local_130;
          plVar10 = puVar11 + 2;
          if ((long *)*puVar11 == plVar10) {
            local_130 = *plVar10;
            lStack_128 = puVar11[3];
          }
          else {
            local_130 = *plVar10;
            local_140 = (long *)*puVar11;
          }
          local_138 = puVar11[1];
          *puVar11 = plVar10;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
          puVar16 = puVar11 + 2;
          if ((ulong *)*puVar11 == puVar16) {
            local_198 = *puVar16;
            lStack_190 = puVar11[3];
            local_1a8 = &local_198;
          }
          else {
            local_198 = *puVar16;
            local_1a8 = (ulong *)*puVar11;
          }
          local_1a0 = puVar11[1];
          *puVar11 = puVar16;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          uVar6 = -local_1cc;
          if (0 < (int)local_1cc) {
            uVar6 = local_1cc;
          }
          uVar21 = 1;
          if (9 < uVar6) {
            uVar17 = (ulong)uVar6;
            uVar4 = 4;
            do {
              uVar21 = uVar4;
              uVar7 = (uint)uVar17;
              if (uVar7 < 100) {
                uVar21 = uVar21 - 2;
                goto LAB_0012777d;
              }
              if (uVar7 < 1000) {
                uVar21 = uVar21 - 1;
                goto LAB_0012777d;
              }
              if (uVar7 < 10000) goto LAB_0012777d;
              uVar17 = uVar17 / 10000;
              uVar4 = uVar21 + 4;
            } while (99999 < uVar7);
            uVar21 = uVar21 + 1;
          }
LAB_0012777d:
          local_188 = local_178;
          std::__cxx11::string::_M_construct((ulong)&local_188,(char)uVar21 - cVar1);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(local_1cc >> 0x1f) + (long)local_188),uVar21,uVar6);
          uVar17 = 0xf;
          if (local_1a8 != &local_198) {
            uVar17 = local_198;
          }
          if (uVar17 < (ulong)(local_180 + local_1a0)) {
            uVar17 = 0xf;
            if (local_188 != local_178) {
              uVar17 = local_178[0];
            }
            if (uVar17 < (ulong)(local_180 + local_1a0)) goto LAB_00127809;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_188,0,(char *)0x0,(ulong)local_1a8);
          }
          else {
LAB_00127809:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_188);
          }
          local_1c8 = &local_1b8;
          plVar10 = puVar11 + 2;
          if ((long *)*puVar11 == plVar10) {
            local_1b8 = *plVar10;
            uStack_1b0 = puVar11[3];
          }
          else {
            local_1b8 = *plVar10;
            local_1c8 = (long *)*puVar11;
          }
          local_1c0 = puVar11[1];
          *puVar11 = plVar10;
          puVar11[1] = 0;
          *(undefined1 *)plVar10 = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c8);
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          psVar18 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_168.field_2._M_allocated_capacity = *psVar18;
            local_168.field_2._8_4_ = (undefined4)plVar10[3];
            local_168.field_2._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
          }
          else {
            local_168.field_2._M_allocated_capacity = *psVar18;
            local_168._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_168._M_string_length = plVar10[1];
          *plVar10 = (long)psVar18;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          (*p_Var19)(local_168._M_dataplus._M_p);
LAB_00127a31:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          if (local_1c8 != &local_1b8) {
            operator_delete(local_1c8,local_1b8 + 1);
          }
          if (local_188 != local_178) {
            operator_delete(local_188,local_178[0] + 1);
          }
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
          if (local_140 != &local_130) {
            operator_delete(local_140,local_130 + 1);
          }
          if (local_120[0] != local_110) {
            operator_delete(local_120[0],local_110[0] + 1);
          }
        }
        else if ((local_38 == (char *)0x0) || (*local_38 == '\0')) {
          p_Var19 = local_148->printErrorFunc;
          local_f0 = CONCAT71(uVar13,1);
          if (p_Var19 != (PrintErrorFunc)0x0) {
            local_120[0] = local_110;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_120,
                       "ERROR: File name must be passed to loadFromString() when you are using \'include\'. At file \'"
                       ,"");
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)local_120,(ulong)(local_148->fileName)._M_dataplus._M_p);
            local_140 = &local_130;
            plVar10 = puVar11 + 2;
            if ((long *)*puVar11 == plVar10) {
              local_130 = *plVar10;
              lStack_128 = puVar11[3];
            }
            else {
              local_130 = *plVar10;
              local_140 = (long *)*puVar11;
            }
            local_138 = puVar11[1];
            *puVar11 = plVar10;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
            puVar16 = (ulong *)(plVar10 + 2);
            if ((ulong *)*plVar10 == puVar16) {
              local_198 = *puVar16;
              lStack_190 = plVar10[3];
              local_1a8 = &local_198;
            }
            else {
              local_198 = *puVar16;
              local_1a8 = (ulong *)*plVar10;
            }
            local_1a0 = plVar10[1];
            *plVar10 = (long)puVar16;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            uVar6 = -local_1cc;
            if (0 < (int)local_1cc) {
              uVar6 = local_1cc;
            }
            uVar21 = 1;
            if (9 < uVar6) {
              uVar17 = (ulong)uVar6;
              uVar4 = 4;
              do {
                uVar21 = uVar4;
                uVar7 = (uint)uVar17;
                if (uVar7 < 100) {
                  uVar21 = uVar21 - 2;
                  goto LAB_0012753e;
                }
                if (uVar7 < 1000) {
                  uVar21 = uVar21 - 1;
                  goto LAB_0012753e;
                }
                if (uVar7 < 10000) goto LAB_0012753e;
                uVar17 = uVar17 / 10000;
                uVar4 = uVar21 + 4;
              } while (99999 < uVar7);
              uVar21 = uVar21 + 1;
            }
LAB_0012753e:
            local_188 = local_178;
            std::__cxx11::string::_M_construct((ulong)&local_188,(char)uVar21 - cVar1);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(local_1cc >> 0x1f) + (long)local_188),uVar21,uVar6);
            uVar17 = 0xf;
            if (local_1a8 != &local_198) {
              uVar17 = local_198;
            }
            if (uVar17 < (ulong)(local_180 + local_1a0)) {
              uVar17 = 0xf;
              if (local_188 != local_178) {
                uVar17 = local_178[0];
              }
              if (uVar17 < (ulong)(local_180 + local_1a0)) goto LAB_001275ca;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_188,0,(char *)0x0,(ulong)local_1a8);
            }
            else {
LAB_001275ca:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_188);
            }
            local_1c8 = &local_1b8;
            plVar10 = puVar11 + 2;
            if ((long *)*puVar11 == plVar10) {
              local_1b8 = *plVar10;
              uStack_1b0 = puVar11[3];
            }
            else {
              local_1b8 = *plVar10;
              local_1c8 = (long *)*puVar11;
            }
            local_1c0 = puVar11[1];
            *puVar11 = plVar10;
            puVar11[1] = 0;
            *(undefined1 *)plVar10 = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c8);
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            psVar18 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_168.field_2._M_allocated_capacity = *psVar18;
              local_168.field_2._8_4_ = (undefined4)plVar10[3];
              local_168.field_2._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
            }
            else {
              local_168.field_2._M_allocated_capacity = *psVar18;
              local_168._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_168._M_string_length = plVar10[1];
            *plVar10 = (long)psVar18;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            (*p_Var19)(local_168._M_dataplus._M_p);
            goto LAB_00127a31;
          }
        }
        else {
          bVar5 = includeFile(local_148,local_a0._M_p,local_148->includeDepth);
          local_f0 = CONCAT71((int7)((ulong)local_f0 >> 8),(byte)local_f0 | !bVar5);
        }
      }
      else {
        std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>::
        push_back(local_40,(value_type *)local_c0);
      }
    }
LAB_00127ae4:
    p_Var9 = (PrintErrorFunc)0x0;
    p_Var19 = (PrintErrorFunc)0x0;
    local_c0._8_8_ = 0;
    *(char *)local_c0._0_8_ = '\0';
    local_98 = 0;
    *local_a0._M_p = '\0';
    local_1cc = local_1cc + (bVar22 == 10);
    bVar5 = true;
    local_100 = 0;
    local_e8 = 0;
  }
  if (bVar22 == 0x3b) {
    p_Var9 = (PrintErrorFunc)CONCAT71((int7)((ulong)p_Var9 >> 8),1);
    p_Var12 = p_Var9;
    if (iVar23 == 0) {
      iVar23 = 0;
      goto LAB_00127c5f;
    }
    bVar22 = 0x3b;
    if (((ulong)(byte)local_f8[(long)iVar23 + -1] < 0x21) &&
       ((0x100000600U >> ((ulong)(byte)local_f8[(long)iVar23 + -1] & 0x3f) & 1) != 0))
    goto LAB_00127c5f;
  }
LAB_00127b6f:
  p_Var12 = p_Var19;
  if (((ulong)p_Var12 & 1) != 0) goto LAB_00127c5f;
  if (bVar5) {
    if (bVar22 != 0x3d && ' ' < (char)bVar22) {
      bVar5 = true;
      std::__cxx11::string::push_back((char)local_c0);
      p_Var12 = (PrintErrorFunc)((ulong)p_Var12 & 0xff);
      goto LAB_00127c5f;
    }
    if (local_c0._8_8_ == 0) {
      bVar5 = true;
      goto LAB_00127c5f;
    }
    local_100 = local_100 & 0xff;
    if (bVar22 == 0x3d) {
      local_100 = 1;
    }
    iVar14 = std::__cxx11::string::compare(local_c0);
    local_e8 = local_e8 & 0xff;
    if (iVar14 == 0) {
      local_e8 = 1;
    }
  }
  else {
    if ((bVar22 == 0x3d) && ((local_100 & 1) == 0)) {
      bVar5 = false;
      local_100 = CONCAT71((int7)((ulong)p_Var9 >> 8),1);
      goto LAB_00127c5f;
    }
    if ((('\x1f' < (char)bVar22) && (bVar22 == 0x3d || (local_100 & 1) != 0)) ||
       ((local_e8 & 1) != 0)) {
      std::__cxx11::string::push_back((char)&local_a0);
    }
  }
  bVar5 = false;
LAB_00127c5f:
  iVar14 = iVar23 + 1;
  p_Var19 = (PrintErrorFunc)((ulong)p_Var12 & 0xffffffff);
  if ((int)local_c8 <= iVar23) goto LAB_00127c80;
  goto LAB_0012678d;
LAB_00127c80:
  bVar22 = (byte)local_f0 ^ 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
LAB_00127cbe:
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
  }
LAB_00127cdb:
  return (bool)(bVar22 & 1);
}

Assistant:

bool loadFromString(const char * data, const char * debug_file_name = "")
  {
    fileName = debug_file_name;

    if (!data)
      return false;

    if (isUtf8Bom(data))
      data += 3;
    int len = int(strlen(data));

    StringKeyValue x;
    bool comment = false;
    bool readKey = true;
    bool eqFound = false;
    bool error = false;
    bool include = false;
    int line = 1;

    for (int i = 0; i <= len; i++)
    {
      char c = data[i];

      if (c == '\\')
      {
        if (i == len - 1)
          i++;
        else
        {
          bool commentAfterConcat = false;
          for (int j = i + 1; j < len; j++)
          {
            if (data[j] == ';' && isSpace(data[j - 1]))
              commentAfterConcat = true;

            if (!commentAfterConcat && data[j] > ' ')
              break;

            bool concat = false;
            if (data[j] == 0x0d && data[j + 1] == 0x0a)
            {
              line++;
              i = j + 2;
              concat = true;
            }
            else if (data[j] == 0x0a)
            {
              line++;
              i = j + 1;
              concat = true;
            }

            if (concat)
            {
              if (comment)
                if (printErrorFunc)
                  printErrorFunc((std::string("ERROR: Line concatenation inside comment. At file '") +
                    fileName + "' line " + std::to_string(line - 1) + "\n").c_str());

              if (data[i] > ' ' && data[i] != ';')
                if (printErrorFunc)
                  printErrorFunc((
                    std::string("ERROR: The next line after the line concatenation symbol '\\' must be started with space. At file '") +
                    fileName + "' line " + std::to_string(line) + "\n").c_str());

              c = data[i];
              break;
            }
          }
        }
      }

      if (c == 0x0d || c == 0x0a || c == 0)
      {
        x.key = trimStr(x.key);
        x.value = trimStr(x.value);
        if (!x.key.empty() && !x.value.empty() && eqFound && !include)
        {
          //printf("%s = \"%s\"\n", x.key.c_str(), x.value.c_str());
          kv.push_back(x);
        }
        else if (!x.key.empty())
        {
          if (include)
          {
            if (!debug_file_name || !debug_file_name[0])
            {
              if (printErrorFunc)
                printErrorFunc(
                  (std::string("ERROR: File name must be passed to loadFromString() when you are using 'include'. At file '") +
                    fileName + "' line " + std::to_string(line) + "\n").c_str());
              error = true;
            }
            else
            {
              bool ok = includeFile(x.value.c_str(), includeDepth);
              error |= !ok;
            }
          }
          else if (!eqFound)
          {
            if (printErrorFunc)
              printErrorFunc(
                (std::string("ERROR: Expected '=' at file '") + fileName + "' line " + std::to_string(line) + "\n").c_str());
            error = true;
          }
          else if (x.value.empty())
          {
            if (printErrorFunc)
              printErrorFunc(
                (std::string("ERROR: Expected value after '=' at file '") + fileName + "' line " + std::to_string(line) + "\n").c_str());
            error = true;
          }
        }

        comment = false;
        readKey = true;
        eqFound = false;
        include = false;
        x.key.clear();
        x.value.clear();

        if (c == 0x0a)
          line++;
      }

      if (c == ';' && (i == 0 || isSpace(data[i - 1]) || data[i - 1] == 0x0a))
        comment = true;

      if (comment)
        continue;

      if (readKey)
      {
        if (!isSpace(c) && c > ' ' && c != '=')
          x.key += c;
        else if (!x.key.empty())
        {
          readKey = false;
          if (c == '=')
            eqFound = true;

          if (x.key == "include")
            include = true;
        }
      }
      else
      {
        if (c == '=' && !eqFound)
          eqFound = true;
        else if ((eqFound && c >= ' ') || include)
          x.value += c;
      }
    }

    return !error;
  }